

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O2

void * integrate_thread(void *arg)

{
  double dVar1;
  double dVar2;
  double __args;
  double dVar3;
  undefined8 local_28;
  
  dVar1 = std::function<double_(double)>::operator()
                    (*(function<double_(double)> **)((long)arg + 0x28),*(double *)((long)arg + 0x10)
                    );
  __args = *(double *)((long)arg + 0x10);
  local_28 = 0.0;
  while( true ) {
    dVar2 = *(double *)((long)arg + 0x20);
    if (dVar2 * -0.5 + *(double *)((long)arg + 0x18) <= __args) break;
    dVar3 = *(double *)((long)arg + 0x18) - __args;
    if (dVar2 <= dVar3) {
      dVar3 = dVar2;
    }
    __args = __args + dVar3;
    dVar2 = std::function<double_(double)>::operator()
                      (*(function<double_(double)> **)((long)arg + 0x28),__args);
    local_28 = local_28 + (dVar1 + dVar2) * dVar3 * 0.5;
    dVar1 = dVar2;
  }
  pthread_mutex_lock(*arg);
  **(double **)((long)arg + 8) = local_28 + **(double **)((long)arg + 8);
  pthread_mutex_unlock(*arg);
  return (void *)0x0;
}

Assistant:

void * integrate_thread(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  double func = (*(p -> func))(p -> a), new_funk, t = p -> a;
  double res  = 0;
  while(t < p -> b - p-> h/2){
    auto h = std::min(p -> h, p -> b - t);
    t += h;
    new_funk = (*(p -> func))(t);
    res +=  (new_funk + func) * h / 2;
    func = new_funk;
  }
  pthread_mutex_lock(p->mutex);
  *(p -> result) += res;
  pthread_mutex_unlock(p->mutex);
  return nullptr;
}